

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Tensor * google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Tensor>(Arena *arena)

{
  Tensor *this;
  
  if (arena == (Arena *)0x0) {
    this = (Tensor *)operator_new(0x30);
    CoreML::Specification::Tensor::Tensor(this,(Arena *)0x0,false);
  }
  else {
    this = (Tensor *)
           AllocateAlignedWithHook(arena,0x30,(type_info *)&CoreML::Specification::Tensor::typeinfo)
    ;
    CoreML::Specification::Tensor::Tensor(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }